

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPTCPTransmitter::DeleteDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  RTPMemoryManager *pRVar3;
  int iVar4;
  _Base_ptr p_Var5;
  iterator __position;
  
  iVar4 = -0xb5;
  if (((this->m_init == true) && (iVar4 = -0xbb, this->m_created == true)) &&
     (iVar4 = -0xbc, addr->addresstype == TCPAddress)) {
    iVar2 = *(int *)&addr->field_0xc;
    if (iVar2 == 0) {
      iVar4 = -0xbd;
    }
    else {
      p_Var5 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      iVar4 = -0xc3;
      if (p_Var5 != (_Base_ptr)0x0) {
        p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
        __position._M_node = &p_Var1->_M_header;
        do {
          if (iVar2 <= (int)p_Var5[1]._M_color) {
            __position._M_node = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2];
        } while (p_Var5 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
           ((int)__position._M_node[1]._M_color <= iVar2)) {
          p_Var5 = __position._M_node[1]._M_right;
          __position._M_node[1]._M_right = (_Base_ptr)0x0;
          if (p_Var5 != (_Base_ptr)0x0) {
            pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
            if (pRVar3 == (RTPMemoryManager *)0x0) {
              operator_delete__(p_Var5);
            }
            else {
              (*pRVar3->_vptr_RTPMemoryManager[3])();
            }
          }
          std::
          _Rb_tree<int,std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>,std::_Select1st<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
          ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>,std::_Select1st<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
                              *)&this->m_destSockets,__position);
          iVar4 = 0;
        }
        return iVar4;
      }
    }
  }
  return iVar4;
}

Assistant:

int RTPTCPTransmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	
	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it == m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETNOTFOUNDINDESTINATIONS;
	}

	// Clean up possibly allocated memory
	uint8_t *pBuf = it->second.ExtractDataBuffer();
	if (pBuf)
		RTPDeleteByteArray(pBuf, GetMemoryManager());

	m_destSockets.erase(it);

	MAINMUTEX_UNLOCK
	return 0;
}